

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_msgpack.hpp
# Opt level: O1

type __thiscall
jsoncons::msgpack::
decode_msgpack<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (msgpack *this,istream *is,msgpack_decode_options *options)

{
  system_error *this_00;
  void *__buf;
  undefined8 extraout_RDX;
  type tVar1;
  error_code __ec;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  adaptor;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  msgpack_stream_reader reader;
  allocator<char> local_3b9;
  json_visitor local_3b8;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *local_3b0;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_3a8;
  error_code local_328;
  basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> local_318;
  
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&local_3a8,(allocator_type *)&local_318,(temp_allocator_type *)&local_3b8);
  local_3b8._vptr_basic_json_visitor = (_func_int **)&PTR__basic_json_visitor_00b5a278;
  local_3b0 = &local_3a8;
  basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_msgpack_reader<std::istream&>
            ((basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             &local_318,is,&local_3b8,options,&local_3b9);
  basic_msgpack_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::read
            (&local_318,(int)is,__buf,(size_t)options);
  if (local_3a8.is_valid_ != false) {
    json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)this);
    local_318.adaptor_.super_basic_item_event_visitor<char>._vptr_basic_item_event_visitor =
         (_func_int **)&PTR__basic_item_event_visitor_to_json_visitor_00b58998;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318.adaptor_.false_constant._M_dataplus._M_p !=
        &local_318.adaptor_.false_constant.field_2) {
      operator_delete(local_318.adaptor_.false_constant._M_dataplus._M_p,
                      local_318.adaptor_.false_constant.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318.adaptor_.true_constant._M_dataplus._M_p !=
        &local_318.adaptor_.true_constant.field_2) {
      operator_delete(local_318.adaptor_.true_constant._M_dataplus._M_p,
                      local_318.adaptor_.true_constant.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318.adaptor_.null_constant._M_dataplus._M_p !=
        &local_318.adaptor_.null_constant.field_2) {
      operator_delete(local_318.adaptor_.null_constant._M_dataplus._M_p,
                      local_318.adaptor_.null_constant.field_2._M_allocated_capacity + 1);
    }
    if (local_318.adaptor_.level_stack_.
        super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_318.adaptor_.level_stack_.
                      super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_318.adaptor_.level_stack_.
                            super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_318.adaptor_.level_stack_.
                            super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318.adaptor_.key_buffer_._M_dataplus._M_p !=
        &local_318.adaptor_.key_buffer_.field_2) {
      operator_delete(local_318.adaptor_.key_buffer_._M_dataplus._M_p,
                      local_318.adaptor_.key_buffer_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318.adaptor_.key_._M_dataplus._M_p != &local_318.adaptor_.key_.field_2) {
      operator_delete(local_318.adaptor_.key_._M_dataplus._M_p,
                      local_318.adaptor_.key_.field_2._M_allocated_capacity + 1);
    }
    local_318.parser_.super_ser_context._vptr_ser_context =
         (_func_int **)&PTR__basic_msgpack_parser_00b587d8;
    if (local_318.parser_.state_stack_.
        super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_318.parser_.state_stack_.
                      super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_318.parser_.state_stack_.
                            super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_318.parser_.state_stack_.
                            super__Vector_base<jsoncons::msgpack::parse_state,_std::allocator<jsoncons::msgpack::parse_state>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_318.parser_.bytes_buffer_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_318.parser_.bytes_buffer_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_318.parser_.bytes_buffer_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_318.parser_.bytes_buffer_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318.parser_.text_buffer_._M_dataplus._M_p !=
        &local_318.parser_.text_buffer_.field_2) {
      operator_delete(local_318.parser_.text_buffer_._M_dataplus._M_p,
                      local_318.parser_.text_buffer_.field_2._M_allocated_capacity + 1);
    }
    stream_source<unsigned_char>::~stream_source(&local_318.parser_.source_);
    if (local_3a8.structure_stack_.
        super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3a8.structure_stack_.
                      super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3a8.structure_stack_.
                            super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3a8.structure_stack_.
                            super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector(&local_3a8.item_stack_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.name_._M_dataplus._M_p != &local_3a8.name_.field_2) {
      operator_delete(local_3a8.name_._M_dataplus._M_p,
                      local_3a8.name_.field_2._M_allocated_capacity + 1);
    }
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_3a8.result_);
    tVar1.field_0.int64_.val_ = extraout_RDX;
    tVar1.field_0._0_8_ = this;
    return (type)tVar1.field_0;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::conv_errc,void>(&local_328,conversion_failed);
  __ec._4_4_ = 0;
  __ec._M_value = local_328._M_value;
  *(undefined ***)(this_00 + 0x50) = &PTR__json_exception_00b58738;
  __ec._M_cat = local_328._M_cat;
  std::system_error::system_error(this_00,__ec);
  *(undefined8 *)this_00 = 0xb586d8;
  *(undefined8 *)(this_00 + 0x50) = 0xb58710;
  *(undefined8 *)(this_00 + 0x20) = 0;
  *(size_t *)(this_00 + 0x28) = local_318.parser_.source_.position_;
  *(system_error **)(this_00 + 0x30) = this_00 + 0x40;
  *(undefined8 *)(this_00 + 0x38) = 0;
  this_00[0x40] = (system_error)0x0;
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,T>::type 
    decode_msgpack(std::istream& is, 
                   const msgpack_decode_options& options = msgpack_decode_options())
    {
        jsoncons::json_decoder<T> decoder;
        auto adaptor = make_json_visitor_adaptor<json_visitor>(decoder);
        msgpack_stream_reader reader(is, adaptor, options);
        reader.read();
        if (!decoder.is_valid())
        {
            JSONCONS_THROW(ser_error(conv_errc::conversion_failed, reader.line(), reader.column()));
        }
        return decoder.get_result();
    }